

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

void __thiscall kj::Exception::wrapContext(Exception *this,char *file,int line,String *description)

{
  Context *pCVar1;
  
  pCVar1 = (Context *)operator_new(0x38);
  pCVar1->file = file;
  pCVar1->line = line;
  (pCVar1->description).content.ptr = (description->content).ptr;
  (pCVar1->description).content.size_ = (description->content).size_;
  (pCVar1->description).content.disposer = (description->content).disposer;
  (description->content).ptr = (char *)0x0;
  (description->content).size_ = 0;
  (pCVar1->next).ptr.disposer = (this->context).ptr.disposer;
  (pCVar1->next).ptr.ptr = (this->context).ptr.ptr;
  (this->context).ptr.disposer = (Disposer *)&kj::_::HeapDisposer<kj::Exception::Context>::instance;
  (this->context).ptr.ptr = pCVar1;
  return;
}

Assistant:

void Exception::wrapContext(const char* file, int line, String&& description) {
  context = heap<Context>(file, line, mv(description), mv(context));
}